

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void updateReg(int nodeIndex)

{
  WINDOW *pWVar1;
  undefined8 uVar2;
  undefined8 in_R9;
  string *psVar3;
  string local_68 [48];
  string local_38 [32];
  reference local_18;
  node *tmp_node;
  int nodeIndex_local;
  
  tmp_node._4_4_ = nodeIndex;
  local_18 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)nodeIndex);
  pWVar1 = local_18->w_reg;
  makeThreeDigit_abi_cxx11_((int)local_38);
  uVar2 = std::__cxx11::string::c_str();
  mvwprintw(pWVar1,1,0,"%s",uVar2);
  std::__cxx11::string::~string(local_38);
  pWVar1 = local_18->w_reg;
  psVar3 = local_68;
  makeThreeDigit_abi_cxx11_((int)psVar3);
  uVar2 = std::__cxx11::string::c_str();
  mvwprintw(pWVar1,3,0,"%s",uVar2,in_R9,psVar3);
  std::__cxx11::string::~string(local_68);
  wrefresh(local_18->w_reg);
  return;
}

Assistant:

void updateReg(int nodeIndex) {
  node *tmp_node = &grid[nodeIndex];

  mvwprintw(tmp_node->w_reg, 1, 0, "%s", makeThreeDigit(tmp_node->acc).c_str());
  mvwprintw(tmp_node->w_reg, 3, 0, "%s", makeThreeDigit(tmp_node->bak).c_str());
  wrefresh(tmp_node->w_reg);
}